

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::UpdateMaxTestNameWidth(cmCTestTestHandler *this)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  cmCTestTestProperties *pcVar4;
  cmCTestTestProperties *p;
  __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_20;
  iterator it;
  size_type max;
  cmCTestTestHandler *this_local;
  
  iVar3 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  it._M_current = (cmCTestTestProperties *)(long)iVar3;
  local_20._M_current =
       (cmCTestTestProperties *)
       std::
       vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
       ::begin(&this->TestList);
  while( true ) {
    p = (cmCTestTestProperties *)
        std::
        vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ::end(&this->TestList);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                        *)&p);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator*(&local_20);
    iVar1 = it;
    pcVar4 = (cmCTestTestProperties *)std::__cxx11::string::size();
    if (iVar1._M_current < pcVar4) {
      it._M_current = (cmCTestTestProperties *)std::__cxx11::string::size();
    }
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator++(&local_20,0);
  }
  iVar3 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  if ((cmCTestTestProperties *)(long)iVar3 != it._M_current) {
    cmCTest::SetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest,(int)it._M_current);
  }
  return;
}

Assistant:

void cmCTestTestHandler::UpdateMaxTestNameWidth()
{
  std::string::size_type max = this->CTest->GetMaxTestNameWidth();
  for (cmCTestTestHandler::ListOfTests::iterator it = this->TestList.begin();
       it != this->TestList.end(); it++) {
    cmCTestTestProperties& p = *it;
    if (max < p.Name.size()) {
      max = p.Name.size();
    }
  }
  if (static_cast<std::string::size_type>(
        this->CTest->GetMaxTestNameWidth()) != max) {
    this->CTest->SetMaxTestNameWidth(static_cast<int>(max));
  }
}